

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  bad_alloc *anon_var_0;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  sigaction sa;
  undefined1 local_c8 [8];
  gulcalcopts gopt;
  int opt;
  char **argv_local;
  int argc_local;
  
  gulcalcopts::gulcalcopts((gulcalcopts *)local_c8);
  gopt.itemLevelOutput = true;
  gopt.coverageLevelOutput = true;
  gopt.correlatedLevelOutput = true;
  gopt._115_1_ = 0xa0;
  gopt.samplesize = 0x3eb0c6f7;
  progname = *argv;
  while (gopt._164_4_ = getopt(argc,argv,"Alvhdrba:L:S:c:i:j:R:s:"), gopt._164_4_ != -1) {
    switch(gopt._164_4_) {
    case (BADTYPE)0x41:
      local_c8._0_4_ = usehashedseed;
      break;
    case (BADTYPE)0x4c:
      gopt._112_8_ = atof(_optarg);
      break;
    case (BADTYPE)0x52:
      local_c8._4_4_ = atoi(_optarg);
      break;
    case (BADTYPE)0x53:
      gopt._108_4_ = atoi(_optarg);
      break;
    case (BADTYPE)0x61:
      gopt.corrout._0_4_ = atoi(_optarg);
      break;
    case (BADTYPE)0x62:
      gopt.corrout._4_1_ = 1;
      break;
    case (BADTYPE)0x63:
      std::__cxx11::string::operator=((string *)&gopt.field_0x28,_optarg);
      gopt._105_1_ = 1;
      break;
    case (BADTYPE)0x64:
      gopt.loss_threshold._0_1_ = 1;
      break;
    case (BADTYPE)0x68:
    default:
      help();
      exit(1);
    case (BADTYPE)0x69:
      std::__cxx11::string::operator=((string *)&gopt.rand_seed,_optarg);
      gopt._104_1_ = 1;
      break;
    case (BADTYPE)0x6a:
      std::__cxx11::string::operator=((string *)&gopt.field_0x48,_optarg);
      gopt._106_1_ = 1;
      break;
    case (BADTYPE)0x6c:
      local_c8._0_4_ = usecachedvector;
      break;
    case (BADTYPE)0x72:
      local_c8._0_4_ = userandomnumberfile;
      break;
    case (BADTYPE)0x73:
      gopt.rndopt = atoi(_optarg);
      break;
    case (BADTYPE)0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  }
  memset(local_170,0,0x98);
  sigemptyset((sigset_t *)&sa);
  local_170 = (undefined1  [8])segfault_sigaction;
  sa.sa_mask.__val[0xf]._0_4_ = 4;
  sigaction(0xb,(sigaction *)local_170,(sigaction *)0x0);
  if ((gopt._104_1_ & 1) == 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gopt.rand_seed,"-");
    if (bVar1) {
      gopt._128_8_ = _stdout;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      gopt._128_8_ = fopen(pcVar2,"wb");
    }
  }
  if ((gopt._105_1_ & 1) == 1) {
    if ((int)(uint)gopt.corrout < 1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gopt.field_0x28,"-");
      if (bVar1) {
        gopt.itemout = _stdout;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        gopt.itemout = (FILE *)fopen(pcVar2,"wb");
      }
    }
    else {
      fprintf(_stderr,
              "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n"
              ,(ulong)(uint)gopt.corrout);
      gopt._105_1_ = 0;
    }
  }
  if ((gopt._106_1_ & 1) == 1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    gopt.covout = (FILE *)fopen(pcVar2,"wb");
    if ((FILE *)gopt.covout == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: Correlated output file name must be specified\n");
      exit(1);
    }
  }
  if (((gopt._104_1_ & 1) == 0) && ((gopt._105_1_ & 1) == 0)) {
    fprintf(_stderr,"FATAL: S%s: No output option selected\n",*argv);
    exit(1);
  }
  if (3 < (int)(uint)gopt.corrout) {
    fprintf(_stderr,"FATAL: Invalid alloc rule %d\n",(ulong)(uint)gopt.corrout);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"",&local_1b9);
  initstreams((string *)local_190,(string *)local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pcVar2 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,pcVar2,&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"INFO",&local_209);
  logprintf((string *)local_1e0,(string *)local_208,"starting process..\n");
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  doit((gulcalcopts *)local_c8);
  pcVar2 = progname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,pcVar2,&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"INFO",(allocator *)((long)&anon_var_0 + 7));
  logprintf((string *)local_230,(string *)local_258,"finishing process..\n");
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  gulcalcopts::~gulcalcopts((gulcalcopts *)local_c8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	gulcalcopts gopt;
	gopt.loss_threshold = 0.000001;
	progname = argv[0];
	while ((opt = getopt(argc, argv, "Alvhdrba:L:S:c:i:j:R:s:")) != -1) {
		switch (opt) {
		case 'S':
			gopt.samplesize = atoi(optarg);
			break;
		case 'l':
			gopt.rndopt = rd_option::usecachedvector;
			break;
		case 'A':
			gopt.rndopt = rd_option::usehashedseed;
			break;
		case 'a':
			gopt.allocRule = atoi(optarg);
			break;
		case 'b':
			gopt.benchmark = true;
			break;
		case 'r':
			gopt.rndopt = rd_option::userandomnumberfile;
			break;
		case 'L':
			gopt.loss_threshold = atof(optarg);
			break;
		case 'R':
			gopt.rand_vector_size = atoi(optarg);
			break;
		case 'i':
			gopt.item_output = optarg;
			gopt.itemLevelOutput = true;
			break;
		case 'j':
			gopt.correlated_output = optarg;
			gopt.correlatedLevelOutput = true;
			break;
		case 'c':
			gopt.coverage_output = optarg;
			gopt.coverageLevelOutput = true;
			break;
		case 'd':
			gopt.debug = true;
			break;		
		case 's':
			gopt.rand_seed = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default: /* '?' */
			help();
			exit(EXIT_FAILURE);
		}
	}

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (gopt.itemLevelOutput == true) {
		if (gopt.item_output == "-") gopt.itemout = stdout;
		else gopt.itemout = fopen(gopt.item_output.c_str(), "wb");
	}
	if (gopt.coverageLevelOutput == true) {
		if (gopt.allocRule <= 0) {
			if (gopt.coverage_output == "-") gopt.covout = stdout;
			else gopt.covout = fopen(gopt.coverage_output.c_str(), "wb");
		} else {
			fprintf(stderr, "WARNING: Alloc rule %d and coverage output are incompatible - ignoring coverage output\n", gopt.allocRule);
			gopt.coverageLevelOutput = false;
		}
	}
	if(gopt.correlatedLevelOutput == true) {
		gopt.corrout = fopen(gopt.correlated_output.c_str(), "wb");
		if(gopt.corrout == NULL) {
			fprintf(stderr, "FATAL: Correlated output file name must be specified\n");
			exit(EXIT_FAILURE);
		}
	}

	if (gopt.itemLevelOutput == false && gopt.coverageLevelOutput == false) {
		fprintf(stderr, "FATAL: S%s: No output option selected\n", argv[0]);
		exit(EXIT_FAILURE);
	}

	if (gopt.allocRule > 3) {
		fprintf(stderr, "FATAL: Invalid alloc rule %d\n", gopt.allocRule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams();
		logprintf(progname, "INFO", "starting process..\n");
		doit(gopt);
		logprintf(progname, "INFO", "finishing process..\n");
	}catch (std::bad_alloc&) {
			fprintf(stderr, "FATAL:%s: Memory allocation failed\n", progname);
			exit(EXIT_FAILURE);
	}

}